

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O0

void __thiscall
Js::ByteCodeWriter::SlotI1(ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId)

{
  code *pcVar1;
  OpCode op_00;
  bool bVar2;
  undefined4 *puVar3;
  OpLayoutType local_20;
  uint32 uStack_1c;
  bool success;
  RegSlot local_18;
  uint32 slotId_local;
  RegSlot value_local;
  OpCode op_local;
  ByteCodeWriter *this_local;
  
  uStack_1c = slotId;
  local_18 = value;
  slotId_local._2_2_ = op;
  _value_local = this;
  CheckOpen(this);
  op_00 = slotId_local._2_2_;
  OpLayoutType::OpLayoutType(&local_20,ElementSlotI1);
  CheckOp(this,op_00,local_20);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(slotId_local._2_2_);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x670,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  local_18 = ConsumeReg(this,local_18);
  if ((((slotId_local._2_2_ != StLocalSlot) && (1 < (ushort)(slotId_local._2_2_ - LdEnvObj))) &&
      (slotId_local._2_2_ != StParamSlot)) &&
     ((1 < (ushort)(slotId_local._2_2_ - StLocalSlotChkUndecl) &&
      (3 < (ushort)(slotId_local._2_2_ - StLocalObjSlot))))) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x687,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,slotId_local._2_2_,local_18,uStack_1c);
  if (((!bVar2) &&
      (bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                         (this,slotId_local._2_2_,local_18,uStack_1c), !bVar2)) &&
     (bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,slotId_local._2_2_,local_18,uStack_1c), !bVar2)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x68d,"(success)","success");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return;
}

Assistant:

void ByteCodeWriter::SlotI1(OpCode op, RegSlot value, uint32 slotId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
            case OpCode::LdEnvObj:
            case OpCode::LdEnvObj_ReuseLoc:
            case OpCode::StLocalSlot:
            case OpCode::StParamSlot:
            case OpCode::StLocalObjSlot:
            case OpCode::StParamObjSlot:
            case OpCode::StLocalSlotChkUndecl:
            case OpCode::StParamSlotChkUndecl:
            case OpCode::StLocalObjSlotChkUndecl:
            case OpCode::StParamObjSlotChkUndecl:
            {
                break;
            }

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }
#endif

        MULTISIZE_LAYOUT_WRITE(ElementSlotI1, op, value, slotId);
    }